

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
          *handler)

{
  char *pcVar1;
  iterator *piVar2;
  internal *end;
  internal *piVar3;
  char cVar4;
  size_t sVar5;
  bool bVar6;
  internal iVar7;
  internal *piVar8;
  char *pcVar9;
  internal *piVar10;
  internal *piVar11;
  long lVar12;
  size_t sVar13;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *this_00;
  char *pcVar14;
  size_t sVar15;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
             *)format_str.size_;
  end = this + (long)format_str.data_;
  piVar3 = this + -1;
  pcVar1 = &(this_00->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .out_.blackhole_;
  do {
    if (this == end) {
      return;
    }
    piVar8 = this;
    if ((*this == (internal)0x7b) ||
       (piVar8 = (internal *)memchr(this,0x7b,(long)end - (long)this), piVar10 = this,
       piVar8 != (internal *)0x0)) {
      if (this != piVar8) {
        piVar10 = this;
        do {
          sVar15 = (long)piVar8 - (long)piVar10;
          pcVar9 = (char *)memchr(piVar10,0x7d,sVar15);
          if (pcVar9 == (char *)0x0) {
            sVar13 = 0;
            piVar11 = (internal *)pcVar1;
            sVar5 = sVar13;
            if (0 < (long)sVar15) {
              piVar11 = piVar8 + -1;
              sVar5 = sVar15;
            }
            iVar7 = *piVar11;
            piVar2 = &(this_00->context).
                      super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                      .out_;
            piVar2->count_ = piVar2->count_ + sVar5;
            (this_00->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .out_.blackhole_ = (char)iVar7;
          }
          else {
            piVar11 = (internal *)(pcVar9 + 1);
            if ((piVar11 == piVar8) || (*piVar11 != (internal)0x7d)) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              sVar13 = 0;
            }
            else {
              lVar12 = (long)piVar11 - (long)piVar10;
              pcVar14 = pcVar9;
              if (lVar12 < 1) {
                lVar12 = 0;
                pcVar14 = pcVar1;
              }
              cVar4 = *pcVar14;
              piVar2 = &(this_00->context).
                        super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                        .out_;
              piVar2->count_ = piVar2->count_ + lVar12;
              (this_00->context).
              super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
              .out_.blackhole_ = cVar4;
              piVar10 = (internal *)(pcVar9 + 2);
              sVar13 = 1;
            }
          }
        } while ((char)sVar13 != '\0');
      }
      piVar10 = piVar8 + 1;
      if (piVar10 == end) {
        pcVar9 = "invalid format string";
        goto LAB_001ec38e;
      }
      if (*piVar10 == (internal)0x7b) {
        iVar7 = piVar8[1];
        piVar2 = &(this_00->context).
                  super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                  .out_;
        piVar2->count_ = piVar2->count_ + 1;
        (this_00->context).
        super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
        .out_.blackhole_ = (char)iVar7;
      }
      else {
        if (*piVar10 != (internal)0x7d) {
          local_58._0_8_ = this_00;
          piVar10 = (internal *)
                    parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&,char>>
                              ((char *)piVar10,(char *)end,
                               (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_&,_char>
                                *)&local_58.string);
          if (piVar10 == end) {
            iVar7 = (internal)0x0;
          }
          else {
            iVar7 = *piVar10;
          }
          if (iVar7 == (internal)0x3a) {
            piVar10 = (internal *)
                      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      ::on_format_specs(this_00,(char *)(piVar10 + 1),(char *)end);
            if ((piVar10 != end) && (*piVar10 == (internal)0x7d)) goto LAB_001ec487;
            pcVar9 = "unknown format specifier";
          }
          else {
            if (iVar7 == (internal)0x7d) goto LAB_001ec47c;
            pcVar9 = "missing \'}\' in format string";
          }
LAB_001ec38e:
          error_handler::on_error((error_handler *)this_00,pcVar9);
          goto LAB_001ec42e;
        }
        basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>::next_arg
                  ((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001ec47c:
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
        ::on_replacement_field(this_00,(char *)piVar10);
      }
LAB_001ec487:
      this = piVar10 + 1;
      bVar6 = true;
    }
    else {
      do {
        sVar15 = (long)end - (long)piVar10;
        pcVar9 = (char *)memchr(piVar10,0x7d,sVar15);
        if (pcVar9 == (char *)0x0) {
          sVar13 = 0;
          piVar8 = (internal *)pcVar1;
          sVar5 = sVar13;
          if (0 < (long)sVar15) {
            piVar8 = piVar3 + (long)format_str.data_;
            sVar5 = sVar15;
          }
          iVar7 = *piVar8;
          piVar2 = &(this_00->context).
                    super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                    .out_;
          piVar2->count_ = piVar2->count_ + sVar5;
          (this_00->context).
          super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
          .out_.blackhole_ = (char)iVar7;
        }
        else {
          piVar8 = (internal *)(pcVar9 + 1);
          if ((piVar8 == end) || (*piVar8 != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            sVar13 = 0;
          }
          else {
            lVar12 = (long)piVar8 - (long)piVar10;
            pcVar14 = pcVar9;
            if (lVar12 < 1) {
              lVar12 = 0;
              pcVar14 = pcVar1;
            }
            cVar4 = *pcVar14;
            piVar2 = &(this_00->context).
                      super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                      .out_;
            piVar2->count_ = piVar2->count_ + lVar12;
            (this_00->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .out_.blackhole_ = cVar4;
            piVar10 = (internal *)(pcVar9 + 2);
            sVar13 = 1;
          }
        }
      } while ((char)sVar13 != '\0');
LAB_001ec42e:
      bVar6 = false;
    }
    if (!bVar6) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}